

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_ComputeInnerForcing
              (ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int stage,sunrealtype t0,sunrealtype tf)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double in_XMM1_Qa;
  int explicit_rhs;
  int implicit_rhs;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  int retval;
  int nstore;
  int nmat;
  int k;
  int j;
  sunrealtype rcdiff;
  int local_78;
  int local_70;
  int local_68;
  int local_64;
  int local_48;
  int local_40;
  int local_3c;
  
  local_64 = *(int *)(in_RSI + 0x1c);
  local_68 = *(int *)(in_RSI + 0x18);
  lVar2 = *(long *)(in_RSI + 0x1f8);
  lVar3 = *(long *)(in_RSI + 0x200);
  *(double *)(*(long *)(in_RSI + 0x168) + 0x30) = in_XMM0_Qa;
  *(double *)(*(long *)(in_RSI + 0x168) + 0x38) = in_XMM1_Qa - in_XMM0_Qa;
  if (**(int **)(in_RSI + 0x48) == 4) {
    local_64 = 0;
    local_68 = 1;
  }
  local_48 = 0;
  local_3c = 0;
  while( true ) {
    local_70 = in_EDX;
    if (*(int *)(in_RSI + 0x58) <= in_EDX) {
      local_70 = *(int *)(in_RSI + 0x58);
    }
    if (local_70 <= local_3c) break;
    if ((local_68 != 0) && (-1 < *(int *)(*(long *)(in_RSI + 0x68) + (long)local_3c * 4))) {
      *(undefined8 *)(lVar3 + (long)local_48 * 8) =
           *(undefined8 *)
            (*(long *)(in_RSI + 0x28) +
            (long)*(int *)(*(long *)(in_RSI + 0x68) + (long)local_3c * 4) * 8);
      local_48 = local_48 + 1;
    }
    if ((local_64 != 0) && (-1 < *(int *)(*(long *)(in_RSI + 0x68) + (long)local_3c * 4))) {
      *(undefined8 *)(lVar3 + (long)local_48 * 8) =
           *(undefined8 *)
            (*(long *)(in_RSI + 0x30) +
            (long)*(int *)(*(long *)(in_RSI + 0x68) + (long)local_3c * 4) * 8);
      local_48 = local_48 + 1;
    }
    local_3c = local_3c + 1;
  }
  iVar1 = *(int *)(*(long *)(in_RSI + 0x48) + 4);
  dVar5 = *(double *)(in_RDI + 0x2c0) / (in_XMM1_Qa - in_XMM0_Qa);
  local_40 = 0;
  while( true ) {
    if (iVar1 <= local_40) {
      return 0;
    }
    local_48 = 0;
    local_3c = 0;
    while( true ) {
      local_78 = in_EDX;
      if (*(int *)(in_RSI + 0x58) <= in_EDX) {
        local_78 = *(int *)(in_RSI + 0x58);
      }
      if (local_78 <= local_3c) break;
      if (-1 < *(int *)(*(long *)(in_RSI + 0x68) + (long)local_3c * 4)) {
        if ((local_68 == 0) || (local_64 == 0)) {
          if (local_68 == 0) {
            *(double *)(lVar2 + (long)local_48 * 8) =
                 dVar5 * *(double *)
                          (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x48) + 0x28) +
                                              (long)local_40 * 8) + (long)in_EDX * 8) +
                          (long)local_3c * 8);
          }
          else {
            *(double *)(lVar2 + (long)local_48 * 8) =
                 dVar5 * *(double *)
                          (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x48) + 0x20) +
                                              (long)local_40 * 8) + (long)in_EDX * 8) +
                          (long)local_3c * 8);
          }
          local_48 = local_48 + 1;
        }
        else {
          *(double *)(lVar2 + (long)local_48 * 8) =
               dVar5 * *(double *)
                        (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x48) + 0x20) +
                                            (long)local_40 * 8) + (long)in_EDX * 8) +
                        (long)local_3c * 8);
          *(double *)(lVar2 + (long)(local_48 + 1) * 8) =
               dVar5 * *(double *)
                        (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x48) + 0x28) +
                                            (long)local_40 * 8) + (long)in_EDX * 8) +
                        (long)local_3c * 8);
          local_48 = local_48 + 2;
        }
      }
      local_3c = local_3c + 1;
    }
    iVar4 = N_VLinearCombination
                      (local_48,lVar2,lVar3,
                       *(undefined8 *)
                        (*(long *)(*(long *)(in_RSI + 0x168) + 0x18) + (long)local_40 * 8));
    if (iVar4 != 0) break;
    local_40 = local_40 + 1;
  }
  return -0x1c;
}

Assistant:

int mriStep_ComputeInnerForcing(SUNDIALS_MAYBE_UNUSED ARKodeMem ark_mem,
                                ARKodeMRIStepMem step_mem, int stage,
                                sunrealtype t0, sunrealtype tf)
{
  sunrealtype rcdiff;
  int j, k, nmat, nstore, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  sunbooleantype implicit_rhs = step_mem->implicit_rhs;
  sunbooleantype explicit_rhs = step_mem->explicit_rhs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Set inner forcing time normalization constants */
  step_mem->stepper->tshift = t0;
  step_mem->stepper->tscale = tf - t0;

  /* Adjust implicit/explicit RHS flags for MRISR methods, since these
     ignore the G coefficients in the forcing function */
  if (step_mem->MRIC->type == MRISTEP_SR)
  {
    implicit_rhs = SUNFALSE;
    explicit_rhs = SUNTRUE;
  }

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < SUNMIN(stage, step_mem->stages); j++)
  {
    if (explicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (implicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ark_mem->h / (tf - t0);

  for (k = 0; k < nmat; k++)
  {
    nstore = 0;
    for (j = 0; j < SUNMIN(stage, step_mem->stages); j++)
    {
      if (step_mem->stage_map[j] > -1)
      {
        if (explicit_rhs && implicit_rhs)
        {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
        else if (explicit_rhs)
        {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        }
        else
        {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

  SUNLogExtraDebugVecArray(ARK_LOGGER, "forcing", nmat,
                           step_mem->stepper->forcing, "forcing_%i(:) =");

  return (ARK_SUCCESS);
}